

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICache.cxx
# Opt level: O2

Value * cmFileAPICacheDump(Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  cmState *this;
  pointer pbVar1;
  bool bVar2;
  CacheEntryType type;
  Value *pVVar3;
  char *pcVar4;
  pointer value;
  pointer value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  Value local_198;
  Value properties;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  this = fileAPI->CMakeInstance->State;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_148,arrayValue);
  cmState::GetCacheEntryKeys_abi_cxx11_(&names,this);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  for (value_00 = names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      value_00 !=
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; value_00 = value_00 + 1) {
    Json::Value::Value(&local_198,objectValue);
    Json::Value::Value(&local_d0,value_00);
    pVVar3 = Json::Value::operator[](&local_198,"name");
    Json::Value::operator=(pVVar3,&local_d0);
    Json::Value::~Value(&local_d0);
    type = cmState::GetCacheEntryType(this,value_00);
    pcVar4 = cmState::CacheEntryTypeToString(type);
    Json::Value::Value(&local_f8,pcVar4);
    pVVar3 = Json::Value::operator[](&local_198,"type");
    Json::Value::operator=(pVVar3,&local_f8);
    Json::Value::~Value(&local_f8);
    pcVar4 = cmState::GetCacheEntryValue(this,value_00);
    Json::Value::Value(&local_120,pcVar4);
    pVVar3 = Json::Value::operator[](&local_198,"value");
    Json::Value::operator=(pVVar3,&local_120);
    Json::Value::~Value(&local_120);
    Json::Value::Value(&properties,arrayValue);
    cmState::GetCacheEntryPropertyList(&props,this,value_00);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pbVar1 = props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value = props.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
      Json::Value::Value(&local_a8,objectValue);
      Json::Value::Value(&local_80,value);
      pVVar3 = Json::Value::operator[](&local_a8,"name");
      Json::Value::operator=(pVVar3,&local_80);
      Json::Value::~Value(&local_80);
      pcVar4 = cmState::GetCacheEntryProperty(this,value_00,value);
      Json::Value::Value(&local_58,pcVar4);
      pVVar3 = Json::Value::operator[](&local_a8,"value");
      Json::Value::operator=(pVVar3,&local_58);
      Json::Value::~Value(&local_58);
      Json::Value::append(&properties,&local_a8);
      Json::Value::~Value(&local_a8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
    bVar2 = Json::Value::empty(&properties);
    if (!bVar2) {
      Json::Value::Value(&local_80,&properties);
      pVVar3 = Json::Value::operator[](&local_198,"properties");
      Json::Value::operator=(pVVar3,&local_80);
      Json::Value::~Value(&local_80);
    }
    Json::Value::~Value(&properties);
    Json::Value::append(&local_148,&local_198);
    Json::Value::~Value(&local_198);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"entries");
  Json::Value::operator=(pVVar3,&local_148);
  Json::Value::~Value(&local_148);
  return __return_storage_ptr__;
}

Assistant:

Cache::Cache(cmFileAPI& fileAPI, unsigned long version)
  : FileAPI(fileAPI)
  , Version(version)
  , State(this->FileAPI.GetCMakeInstance()->GetState())
{
  static_cast<void>(this->Version);
}